

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O2

int fe_process_utt(fe_t *fe,int16 *spch,size_t nsamps,mfcc_t ***cep_block,int32 *nframes)

{
  byte bVar1;
  int iVar2;
  mfcc_t **buf_cep;
  size_t d1;
  size_t nsamps_local;
  int16 *spch_local;
  
  nsamps_local = nsamps;
  spch_local = spch;
  fe_process_frames_int16(fe,(int16 **)0x0,&nsamps_local,(mfcc_t **)0x0,nframes);
  d1 = (size_t)*nframes;
  if (d1 == 0) {
    bVar1 = fe->feature_dimension;
    d1 = 1;
    iVar2 = 0x208;
  }
  else {
    bVar1 = fe->feature_dimension;
    iVar2 = 0x206;
  }
  buf_cep = (mfcc_t **)
            __ckd_calloc_2d__(d1,(ulong)bVar1,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                              ,iVar2);
  iVar2 = fe_process_frames_int16(fe,&spch_local,&nsamps_local,buf_cep,nframes);
  *cep_block = buf_cep;
  return iVar2;
}

Assistant:

int
fe_process_utt(fe_t * fe, int16 const * spch, size_t nsamps,
               mfcc_t *** cep_block, int32 * nframes)
{
    mfcc_t **cep;
    int rv;

    /* Figure out how many frames we will need. */
    fe_process_frames_int16(fe, NULL, &nsamps, NULL, nframes);
    /* Create the output buffer (it has to exist, even if there are no output frames). */
    if (*nframes)
        cep = (mfcc_t **)ckd_calloc_2d(*nframes, fe->feature_dimension, sizeof(**cep));
    else
        cep = (mfcc_t **)ckd_calloc_2d(1, fe->feature_dimension, sizeof(**cep));
    /* Now just call fe_process_frames() with the allocated buffer. */
    rv = fe_process_frames_int16(fe, &spch, &nsamps, cep, nframes);
    *cep_block = cep;

    return rv;
}